

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_lu.c
# Opt level: O0

X509_OBJECT * X509_OBJECT_new(void)

{
  X509_OBJECT *func;
  char *unaff_retaddr;
  X509_OBJECT *ret;
  undefined8 in_stack_fffffffffffffff0;
  char *in_stack_fffffffffffffff8;
  int line;
  
  func = (X509_OBJECT *)
         CRYPTO_zalloc((size_t)unaff_retaddr,in_stack_fffffffffffffff8,
                       (int)((ulong)in_stack_fffffffffffffff0 >> 0x20));
  line = (int)((ulong)in_stack_fffffffffffffff8 >> 0x20);
  if (func == (X509_OBJECT *)0x0) {
    ERR_new();
    ERR_set_debug(unaff_retaddr,line,(char *)func);
    ERR_set_error(0xb,0xc0100,(char *)0x0);
    func = (X509_OBJECT *)0x0;
  }
  else {
    func->type = X509_LU_NONE;
  }
  return func;
}

Assistant:

X509_OBJECT *X509_OBJECT_new(void)
{
    X509_OBJECT *ret = OPENSSL_zalloc(sizeof(*ret));

    if (ret == NULL) {
        ERR_raise(ERR_LIB_X509, ERR_R_MALLOC_FAILURE);
        return NULL;
    }
    ret->type = X509_LU_NONE;
    return ret;
}